

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::CropResizeLayerParams::ByteSizeLong(CropResizeLayerParams *this)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  
  sVar3 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->targetsize_);
  if (sVar3 == 0) {
    lVar6 = 0;
  }
  else {
    uVar5 = (long)(int)sVar3 | 1;
    lVar6 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    lVar6 = (ulong)((int)lVar6 * 9 + 0x49U >> 6) + 1;
  }
  (this->_targetsize_cached_byte_size_).super___atomic_base<int>._M_i = (int)sVar3;
  sVar3 = lVar6 + sVar3;
  if (this->mode_ != (SamplingMode *)0x0 &&
      this != (CropResizeLayerParams *)_CropResizeLayerParams_default_instance_) {
    sVar4 = SamplingMode::ByteSizeLong(this->mode_);
    uVar2 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->boxindicesmode_ != (BoxCoordinatesMode *)0x0 &&
      this != (CropResizeLayerParams *)_CropResizeLayerParams_default_instance_) {
    sVar4 = BoxCoordinatesMode::ByteSizeLong(this->boxindicesmode_);
    uVar2 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = sVar3 + 2;
  if (this->normalizedcoordinates_ == false) {
    sVar4 = sVar3;
  }
  sVar3 = sVar4 + 5;
  if (this->spatialscale_ == 0.0) {
    sVar3 = sVar4;
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar5 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
  return sVar3;
}

Assistant:

size_t CropResizeLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CropResizeLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated uint64 targetSize = 1;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      UInt64Size(this->targetsize_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _targetsize_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // .CoreML.Specification.SamplingMode mode = 3;
  if (this->_internal_has_mode()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *mode_);
  }

  // .CoreML.Specification.BoxCoordinatesMode boxIndicesMode = 4;
  if (this->_internal_has_boxindicesmode()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *boxindicesmode_);
  }

  // bool normalizedCoordinates = 2;
  if (this->_internal_normalizedcoordinates() != 0) {
    total_size += 1 + 1;
  }

  // float spatialScale = 5;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_spatialscale = this->_internal_spatialscale();
  uint32_t raw_spatialscale;
  memcpy(&raw_spatialscale, &tmp_spatialscale, sizeof(tmp_spatialscale));
  if (raw_spatialscale != 0) {
    total_size += 1 + 4;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}